

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImTriangleBarycentricCoords
               (ImVec2 *a,ImVec2 *b,ImVec2 *c,ImVec2 *p,float *out_u,float *out_v,float *out_w)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  fVar1 = (*a).x;
  fVar7 = c->x - fVar1;
  fVar5 = b->x - fVar1;
  fVar4 = (*a).y;
  fVar6 = c->y - fVar4;
  fVar1 = p->x - fVar1;
  fVar3 = b->y - fVar4;
  fVar4 = p->y - fVar4;
  fVar2 = fVar6 * fVar5 - fVar7 * fVar3;
  *out_v = (fVar1 * fVar6 - fVar7 * fVar4) / fVar2;
  fVar2 = (fVar4 * fVar5 - fVar3 * fVar1) / fVar2;
  *out_w = fVar2;
  *out_u = (1.0 - *out_v) - fVar2;
  return;
}

Assistant:

void ImTriangleBarycentricCoords(const ImVec2& a, const ImVec2& b, const ImVec2& c, const ImVec2& p, float& out_u, float& out_v, float& out_w)
{
    ImVec2 v0 = b - a;
    ImVec2 v1 = c - a;
    ImVec2 v2 = p - a;
    const float denom = v0.x * v1.y - v1.x * v0.y;
    out_v = (v2.x * v1.y - v1.x * v2.y) / denom;
    out_w = (v0.x * v2.y - v2.x * v0.y) / denom;
    out_u = 1.0f - out_v - out_w;
}